

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

int __thiscall
rr::SingleSampleLineRasterizer::init(SingleSampleLineRasterizer *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  float *in_RDX;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  float in_XMM0_Da;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar18 = *in_RDX - *(float *)ctx;
  fVar17 = in_RDX[1] - *(float *)(ctx + 4);
  fVar19 = -fVar18;
  if (-fVar18 <= fVar18) {
    fVar19 = fVar18;
  }
  fVar18 = -fVar17;
  if (-fVar17 <= fVar17) {
    fVar18 = fVar17;
  }
  iVar12 = 1;
  if (1.0 < in_XMM0_Da) {
    fVar17 = floorf(in_XMM0_Da + 0.5);
    iVar12 = (int)fVar17;
  }
  lVar4 = (long)-(iVar12 * 0x100 + -0x100 >> 1);
  lVar5 = 0;
  if (fVar18 <= fVar19) {
    lVar5 = lVar4;
    lVar4 = 0;
  }
  uVar15 = -(uint)(*(float *)ctx < 0.0);
  lVar7 = (long)(*(float *)ctx * 256.0 + (float)(~uVar15 & 0x3f000000 | uVar15 & 0xbf000000)) +
          lVar4;
  uVar15 = -(uint)(*(float *)(ctx + 4) < 0.0);
  lVar10 = (long)(*(float *)(ctx + 4) * 256.0 + (float)(~uVar15 & 0x3f000000 | uVar15 & 0xbf000000))
           + lVar5;
  uVar15 = -(uint)(*in_RDX < 0.0);
  uVar16 = -(uint)(in_RDX[1] < 0.0);
  lVar4 = (long)(*in_RDX * 256.0 + (float)(~uVar15 & 0x3f000000 | uVar15 & 0xbf000000)) + lVar4;
  lVar5 = (long)(in_RDX[1] * 256.0 + (float)(~uVar16 & 0x3f000000 | uVar16 & 0xbf000000)) + lVar5;
  lVar9 = lVar4;
  if (lVar7 < lVar4) {
    lVar9 = lVar7;
  }
  if (lVar4 < lVar7) {
    lVar4 = lVar7;
  }
  lVar9 = lVar9 + -0x100;
  lVar7 = lVar5;
  if (lVar10 < lVar5) {
    lVar7 = lVar10;
  }
  if (lVar5 < lVar10) {
    lVar5 = lVar10;
  }
  lVar7 = lVar7 + -0x100;
  lVar10 = 0xffffffff00;
  if (fVar19 < fVar18) {
    lVar14 = 0xffffffff00;
    if (-1 < lVar7) {
      lVar14 = -1;
    }
    iVar3 = (this->m_viewport).m_data[0];
    iVar11 = (this->m_viewport).m_data[1];
    iVar6 = (this->m_viewport).m_data[3] + iVar11 + -1;
    iVar8 = (int)((ulong)(lVar14 + lVar7) >> 8);
    iVar13 = iVar6;
    if (iVar8 < iVar6) {
      iVar13 = iVar8;
    }
    if (iVar8 < iVar11) {
      iVar13 = iVar11;
    }
    iVar8 = (int)((ulong)(lVar5 + 0x200) >> 8);
    if (lVar5 + 0x100 < 0) {
      iVar8 = (int)((ulong)(lVar5 + 0x101) >> 8);
    }
    if (iVar8 < iVar6) {
      iVar6 = iVar8;
    }
    if (iVar8 < iVar11) {
      iVar6 = iVar11;
    }
    if (-1 < lVar9) {
      lVar10 = -1;
    }
    iVar8 = iVar3 + (this->m_viewport).m_data[2] + -1;
    iVar3 = iVar3 - iVar12;
    iVar12 = (int)((ulong)(lVar10 + lVar9) >> 8);
    iVar11 = iVar8;
    if (iVar12 < iVar8) {
      iVar11 = iVar12;
    }
    if (iVar12 < iVar3) {
      iVar11 = iVar3;
    }
    iVar12 = (int)((ulong)(lVar4 + 0x101) >> 8);
    if (-1 < lVar4 + 0x100) {
      iVar12 = (int)((ulong)(lVar4 + 0x200) >> 8);
    }
    if (iVar12 < iVar8) {
      iVar8 = iVar12;
    }
    if (iVar12 < iVar3) {
      iVar8 = iVar3;
    }
  }
  else {
    lVar14 = 0xffffffff00;
    if (-1 < lVar9) {
      lVar14 = -1;
    }
    iVar3 = (this->m_viewport).m_data[0];
    iVar2 = (this->m_viewport).m_data[1];
    iVar8 = (this->m_viewport).m_data[2] + iVar3 + -1;
    iVar13 = (int)((ulong)(lVar14 + lVar9) >> 8);
    iVar11 = iVar8;
    if (iVar13 < iVar8) {
      iVar11 = iVar13;
    }
    if (iVar13 < iVar3) {
      iVar11 = iVar3;
    }
    iVar13 = (int)((ulong)(lVar4 + 0x200) >> 8);
    if (lVar4 + 0x100 < 0) {
      iVar13 = (int)((ulong)(lVar4 + 0x101) >> 8);
    }
    if (iVar13 < iVar8) {
      iVar8 = iVar13;
    }
    if (iVar13 < iVar3) {
      iVar8 = iVar3;
    }
    if (-1 < lVar7) {
      lVar10 = -1;
    }
    iVar6 = iVar2 + (this->m_viewport).m_data[3] + -1;
    iVar2 = iVar2 - iVar12;
    iVar12 = (int)((ulong)(lVar10 + lVar7) >> 8);
    iVar13 = iVar6;
    if (iVar12 < iVar6) {
      iVar13 = iVar12;
    }
    if (iVar12 < iVar2) {
      iVar13 = iVar2;
    }
    iVar12 = (int)((ulong)(lVar5 + 0x101) >> 8);
    if (-1 < lVar5 + 0x100) {
      iVar12 = (int)((ulong)(lVar5 + 0x200) >> 8);
    }
    if (iVar12 < iVar6) {
      iVar6 = iVar12;
    }
    if (iVar12 < iVar2) {
      iVar6 = iVar2;
    }
  }
  (this->m_bboxMin).m_data[0] = iVar11;
  (this->m_bboxMax).m_data[0] = iVar8;
  (this->m_bboxMin).m_data[1] = iVar13;
  (this->m_bboxMax).m_data[1] = iVar6;
  this->m_lineWidth = in_XMM0_Da;
  uVar1 = *(undefined8 *)(ctx + 8);
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)ctx;
  *(undefined8 *)((this->m_v0).m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(in_RDX + 2);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)in_RDX;
  *(undefined8 *)((this->m_v1).m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(this->m_bboxMin).m_data;
  *(undefined8 *)(this->m_curPos).m_data = uVar1;
  this->m_curRowFragment = 0;
  return (int)uVar1;
}

Assistant:

void SingleSampleLineRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, float lineWidth)
{
	const bool						isXMajor		= de::abs((v1 - v0).x()) >= de::abs((v1 - v0).y());

	// Bounding box \note: with wide lines, the line is actually moved as in the spec
	const deInt32					lineWidthPixels	= (lineWidth > 1.0f) ? (deInt32)floor(lineWidth + 0.5f) : 1;

	const tcu::Vector<deInt64,2>	widthOffset		= (isXMajor ? tcu::Vector<deInt64,2>(0, -1) : tcu::Vector<deInt64,2>(-1, 0)) * (toSubpixelCoord(lineWidthPixels - 1) / 2);

	const deInt64					x0				= toSubpixelCoord(v0.x()) + widthOffset.x();
	const deInt64					y0				= toSubpixelCoord(v0.y()) + widthOffset.y();
	const deInt64					x1				= toSubpixelCoord(v1.x()) + widthOffset.x();
	const deInt64					y1				= toSubpixelCoord(v1.y()) + widthOffset.y();

	// line endpoints might be perturbed, add some margin
	const deInt64					xMin			= de::min(x0, x1) - toSubpixelCoord(1);
	const deInt64					xMax			= de::max(x0, x1) + toSubpixelCoord(1);
	const deInt64					yMin			= de::min(y0, y1) - toSubpixelCoord(1);
	const deInt64					yMax			= de::max(y0, y1) + toSubpixelCoord(1);

	// Remove invisible area

	if (isXMajor)
	{
		// clamp to viewport in major direction
		m_bboxMin.x() = de::clamp(floorSubpixelToPixelCoord(xMin, true), m_viewport.x(), m_viewport.x() + m_viewport.z() - 1);
		m_bboxMax.x() = de::clamp(ceilSubpixelToPixelCoord (xMax, true), m_viewport.x(), m_viewport.x() + m_viewport.z() - 1);

		// clamp to padded viewport in minor direction (wide lines might bleed over viewport in minor direction)
		m_bboxMin.y() = de::clamp(floorSubpixelToPixelCoord(yMin, true), m_viewport.y() - lineWidthPixels, m_viewport.y() + m_viewport.w() - 1);
		m_bboxMax.y() = de::clamp(ceilSubpixelToPixelCoord (yMax, true), m_viewport.y() - lineWidthPixels, m_viewport.y() + m_viewport.w() - 1);
	}
	else
	{
		// clamp to viewport in major direction
		m_bboxMin.y() = de::clamp(floorSubpixelToPixelCoord(yMin, true), m_viewport.y(), m_viewport.y() + m_viewport.w() - 1);
		m_bboxMax.y() = de::clamp(ceilSubpixelToPixelCoord (yMax, true), m_viewport.y(), m_viewport.y() + m_viewport.w() - 1);

		// clamp to padded viewport in minor direction (wide lines might bleed over viewport in minor direction)
		m_bboxMin.x() = de::clamp(floorSubpixelToPixelCoord(xMin, true), m_viewport.x() - lineWidthPixels, m_viewport.x() + m_viewport.z() - 1);
		m_bboxMax.x() = de::clamp(ceilSubpixelToPixelCoord (xMax, true), m_viewport.x() - lineWidthPixels, m_viewport.x() + m_viewport.z() - 1);
	}

	m_lineWidth = lineWidth;

	m_v0 = v0;
	m_v1 = v1;

	m_curPos = m_bboxMin;
	m_curRowFragment = 0;
}